

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O0

monst * shkcatch(obj *obj,xchar x,xchar y)

{
  level *lev;
  char cVar1;
  boolean bVar2;
  int iVar3;
  monst *mtmp;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  obj *poVar7;
  bool bVar8;
  monst *shkp;
  xchar y_local;
  xchar x_local;
  obj *obj_local;
  
  lev = level;
  cVar1 = inside_shop(level,x,y);
  mtmp = shop_keeper(lev,cVar1);
  if ((mtmp == (monst *)0x0) || (iVar3 = inhishop(mtmp), iVar3 == 0)) {
    return (monst *)0x0;
  }
  if (((((*(uint *)&mtmp->field_0x60 >> 0x12 & 1) == 0) ||
       ((*(uint *)&mtmp->field_0x60 >> 0x13 & 1) != 0)) ||
      ((u.ushops[0] == (char)mtmp[0x1b].meating &&
       (cVar1 = inside_shop(level,u.ux,u.uy), cVar1 != '\0')))) ||
     ((iVar3 = dist2((int)mtmp->mx,(int)mtmp->my,(int)x,(int)y), 2 < iVar3 ||
      ((mtmp->mx == x && (mtmp->my == y)))))) {
    return (monst *)0x0;
  }
  bVar2 = mnearto(mtmp,x,y,'\x01');
  if (bVar2 != '\0') {
    verbalize("Out of my way, scum!");
  }
  if ((viz_array[y][x] & 2U) == 0) goto LAB_002d0250;
  pcVar4 = Monnam(mtmp);
  bVar8 = false;
  if (x == mtmp->mx) {
    bVar8 = y == mtmp->my;
  }
  pcVar5 = " reaches over and";
  if (bVar8) {
    pcVar5 = "";
  }
  pcVar6 = xname(obj);
  pcVar6 = the(pcVar6);
  pline("%s nimbly%s catches %s.",pcVar4,pcVar5,pcVar6);
  if (mtmp->wormno == '\0') {
    if (((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) ||
       ((((u.uprops[0x1e].intrinsic == 0 &&
          (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
           (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
        (((u.uprops[0x40].intrinsic != 0 ||
          ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
         (((mtmp->data->mflags3 & 0x200) != 0 && ((viz_array[mtmp->my][mtmp->mx] & 1U) != 0))))))))
    goto LAB_002cffe7;
LAB_002d0074:
    if (((((mtmp->data->mflags1 & 0x10000) != 0) ||
         ((poVar7 = which_armor(mtmp,4), poVar7 != (obj *)0x0 &&
          (poVar7 = which_armor(mtmp,4), poVar7->otyp == 0x4f)))) ||
        (((((u.uprops[0x1e].intrinsic == 0 &&
            (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
             (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
           (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
            ((((u.uprops[0x19].intrinsic == 0 &&
               ((u.uprops[0x19].extrinsic == 0 && (youmonst.data != mons + 0x1e)))) &&
              (youmonst.data != mons + 0x31)) && (youmonst.data != mons + 0x32)))))) ||
          (u.uprops[0x19].blocked != 0)) &&
         (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
          (iVar3 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), 0x40 < iVar3)))))) &&
       (((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)) &&
        (bVar2 = match_warn_of_mon(mtmp), bVar2 == '\0')))) {
      map_invisible(x,y);
    }
  }
  else {
    bVar2 = worm_known(level,mtmp);
    if (bVar2 == '\0') goto LAB_002d0074;
LAB_002cffe7:
    if (((((((*(uint *)&mtmp->field_0x60 >> 1 & 1) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
          (u.uprops[0xc].extrinsic == 0)) && (((youmonst.data)->mflags1 & 0x1000000) == 0)) ||
        (((*(uint *)&mtmp->field_0x60 >> 7 & 1) != 0 || ((*(uint *)&mtmp->field_0x60 >> 9 & 1) != 0)
         ))) || (((byte)u._1052_1_ >> 5 & 1) != 0)) goto LAB_002d0074;
  }
  (*windowprocs.win_delay)();
LAB_002d0250:
  subfrombill(obj,mtmp);
  mpickobj(mtmp,obj);
  return mtmp;
}

Assistant:

struct monst *shkcatch(struct obj *obj, xchar x, xchar y)
{
	struct monst *shkp;

	if (!(shkp = shop_keeper(level, inside_shop(level, x, y))) ||
	    !inhishop(shkp)) return 0;

	if (shkp->mcanmove && !shkp->msleeping &&
	    (*u.ushops != ESHK(shkp)->shoproom || !inside_shop(level, u.ux, u.uy)) &&
	    dist2(shkp->mx, shkp->my, x, y) < 3 &&
	    /* if it is the shk's pos, you hit and anger him */
	    (shkp->mx != x || shkp->my != y)) {
		if (mnearto(shkp, x, y, TRUE))
		    verbalize("Out of my way, scum!");
		if (cansee(x, y)) {
		    pline("%s nimbly%s catches %s.",
			  Monnam(shkp),
			  (x == shkp->mx && y == shkp->my) ? "" : " reaches over and",
			  the(xname(obj)));
		    if (!canspotmon(level, shkp))
			map_invisible(x, y);
		    win_delay_output();
		}
		subfrombill(obj, shkp);
		mpickobj(shkp, obj);
		return shkp;
	}
	return NULL;
}